

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O0

void __thiscall
ST::string::to_buffer(string *this,char_buffer *result,bool utf8,bool substitute_out_of_range)

{
  char_buffer local_60;
  char_buffer local_40;
  undefined1 local_1a;
  undefined1 local_19;
  bool substitute_out_of_range_local;
  char_buffer *pcStack_18;
  bool utf8_local;
  char_buffer *result_local;
  string *this_local;
  
  local_1a = substitute_out_of_range;
  local_19 = utf8;
  pcStack_18 = result;
  result_local = &this->m_buffer;
  if (utf8) {
    to_utf8(&local_40,this);
    buffer<char>::operator=(pcStack_18,&local_40);
    buffer<char>::~buffer(&local_40);
  }
  else {
    to_latin_1(&local_60,this,substitute_out_of_range);
    buffer<char>::operator=(pcStack_18,&local_60);
    buffer<char>::~buffer(&local_60);
  }
  return;
}

Assistant:

void to_buffer(char_buffer &result, bool utf8 = true,
                       bool substitute_out_of_range = true) const
        {
            if (utf8)
                result = to_utf8();
            else
                result = to_latin_1(substitute_out_of_range);
        }